

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAutoTableElement.cpp
# Opt level: O0

void __thiscall
KDReports::AutoTableElementPrivate::createHorizontalHeader
          (AutoTableElementPrivate *this,ReportBuilder *builder,QTextDocument *textDoc,
          QTextTable *textTable,int columns,int headerColumnCount)

{
  bool bVar1;
  undefined8 uVar2;
  QTextTableCellFormat local_68 [8];
  QTextTableCellFormat tableHeaderFormat;
  QTextTableCell local_48 [8];
  QTextTableCell cell;
  int local_34;
  int column;
  int headerColumnCount_local;
  int columns_local;
  QTextTable *textTable_local;
  QTextDocument *textDoc_local;
  ReportBuilder *builder_local;
  AutoTableElementPrivate *this_local;
  
  if ((this->m_horizontalHeaderVisible & 1U) != 0) {
    for (local_34 = 0; local_34 < columns; local_34 = local_34 + 1) {
      QTextTable::cellAt((int)local_48,(int)textTable);
      bVar1 = QTextTableCell::isValid(local_48);
      if (!bVar1) {
        uVar2 = qt_assert("cell.isValid()",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsAutoTableElement.cpp"
                          ,0xff);
        QTextTableCell::~QTextTableCell(local_48);
        _Unwind_Resume(uVar2);
      }
      QTextTableCellFormat::QTextTableCellFormat(local_68);
      QTextFormat::setBackground((QTextFormat *)local_68,&this->m_headerBackground);
      bVar1 = std::function::operator_cast_to_bool((function *)&this->m_horizontalHeaderFormatFunc);
      if (bVar1) {
        std::function<void_(int,_QTextTableCellFormat_&)>::operator()
                  (&this->m_horizontalHeaderFormatFunc,local_34,local_68);
      }
      QTextTableCell::setFormat((QTextCharFormat *)local_48);
      fillCellFromHeaderData(this,local_34,Horizontal,local_48,textDoc,textTable,builder);
      QTextTableCellFormat::~QTextTableCellFormat(local_68);
      QTextTableCell::~QTextTableCell(local_48);
    }
  }
  return;
}

Assistant:

void KDReports::AutoTableElementPrivate::createHorizontalHeader(ReportBuilder &builder, QTextDocument &textDoc, QTextTable *textTable, int columns, int headerColumnCount) const
{
    if (m_horizontalHeaderVisible) {
        for (int column = 0; column < columns; column++) {
            QTextTableCell cell = textTable->cellAt(0, column + headerColumnCount);
            Q_ASSERT(cell.isValid());
            QTextTableCellFormat tableHeaderFormat;
            tableHeaderFormat.setBackground(m_headerBackground);
            if (m_horizontalHeaderFormatFunc)
                m_horizontalHeaderFormatFunc(column, tableHeaderFormat);
            cell.setFormat(tableHeaderFormat);
            fillCellFromHeaderData(column, Qt::Horizontal, cell, textDoc, textTable, builder);
        }
    }
}